

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O3

void __thiscall serialize_tests::with_params_multi::test_method(with_params_multi *this)

{
  int iVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  Base base2;
  lazy_ostream local_160;
  undefined1 *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  Base base1;
  ParamsStream<ParamsStream<ParamsStream<DataStream_&,_serialize_tests::OtherParam>,_serialize_tests::OtherParam>,_serialize_tests::BaseFormat>
  pstream;
  DataStream stream;
  OtherParamChecker check;
  OtherParam other_param_override;
  OtherParam other_param_ignored;
  OtherParam other_param_used;
  undefined1 local_d0 [24];
  assertion_result local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_80;
  ParamsStream<ParamsStream<ParamsStream<ParamsStream<DataStream_&,_serialize_tests::OtherParam>,_serialize_tests::OtherParam>,_serialize_tests::BaseFormat>_&,_serialize_tests::OtherParam>
  local_78;
  undefined1 *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pstream.m_substream.m_params = &other_param_used;
  other_param_used.param = '\x10';
  pstream.m_substream.m_substream.m_params = &other_param_ignored;
  other_param_ignored.param = '\x11';
  other_param_override.param = '\x12';
  pstream.m_substream.m_substream.m_substream = &stream;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stream.m_read_pos = 0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pstream.m_params = (BaseFormat *)&RAW;
  base1.m_base_data = ' ';
  Base::
  Serialize<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>>
            (&base1,&pstream);
  local_78.m_params._0_1_ = (pstream.m_substream.m_params)->param;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)
             pstream.m_substream.m_substream.m_substream,
             ((pstream.m_substream.m_substream.m_substream)->vch).
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_78);
  local_78.m_params = (OtherParam *)CONCAT71(local_78.m_params._1_7_,0x12);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)
             pstream.m_substream.m_substream.m_substream,
             ((pstream.m_substream.m_substream.m_substream)->vch).
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_78);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x195;
  file.m_begin = (iterator)&local_130;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_140,msg);
  local_160.m_empty = false;
  local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_150 = boost::unit_test::lazy_ostream::inst;
  local_148 = "";
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&local_58,
             stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start + stream.m_read_pos,
             stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58," \x10\x12");
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar1 == 0);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_d0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
       + 0x61;
  local_60 = &local_a0;
  local_78.m_substream =
       (ParamsStream<ParamsStream<ParamsStream<DataStream_&,_serialize_tests::OtherParam>,_serialize_tests::OtherParam>,_serialize_tests::BaseFormat>
        *)((ulong)local_78.m_substream & 0xffffffffffffff00);
  local_78.m_params = (OtherParam *)&PTR__lazy_ostream_013ae148;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_d0;
  local_d0._0_8_ = " \x10\x12";
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013ae898;
  local_88 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a0 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_160,1,2,REQUIRE,0xf10851,(size_t)(local_d0 + 8),0x195,&local_78,
             "\"\\x20\\x10\\x12\"",&local_98);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  base2.m_base_data = '\x11';
  Base::
  Unserialize<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>>
            (&base2,&pstream);
  OtherParamChecker::
  Unserialize<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>>
            (&check,&pstream);
  local_78.m_params = &other_param_override;
  local_78.m_substream = &pstream;
  OtherParamChecker::
  Unserialize<ParamsStream<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>&,serialize_tests::OtherParam>>
            (&check,&local_78);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x199;
  file_00.m_begin = (iterator)&local_178;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_188,
             msg_00);
  local_160.m_empty = false;
  local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_150 = boost::unit_test::lazy_ostream::inst;
  local_148 = "";
  local_d0._0_4_ = 0x20;
  local_58._M_dataplus._M_p._0_1_ = base2.m_base_data == ' ';
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_b8.m_message.px = (element_type *)0xf10351;
  local_78.m_substream =
       (ParamsStream<ParamsStream<ParamsStream<DataStream_&,_serialize_tests::OtherParam>,_serialize_tests::OtherParam>,_serialize_tests::BaseFormat>
        *)((ulong)local_78.m_substream & 0xffffffffffffff00);
  local_78.m_params = (OtherParam *)&PTR__lazy_ostream_013aee50;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013ae248;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_a0;
  local_d0._8_8_ = &base2;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_d0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,&local_160,1,2,REQUIRE,0xf10871,(size_t)&local_b8,0x199,
             &local_78,"0x20",&local_98);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(with_params_multi)
{
    const OtherParam other_param_used{.param = 0x10};
    const OtherParam other_param_ignored{.param = 0x11};
    const OtherParam other_param_override{.param = 0x12};
    const OtherParamChecker check;
    DataStream stream;
    ParamsStream pstream{stream, RAW, other_param_used, other_param_ignored};

    Base base1{0x20};
    pstream << base1 << check << other_param_override(check);
    BOOST_CHECK_EQUAL(stream.str(), "\x20\x10\x12");

    Base base2;
    pstream >> base2 >> check >> other_param_override(check);
    BOOST_CHECK_EQUAL(base2.m_base_data, 0x20);
}